

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astBreakNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameRecord_t *targetRecord;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_28;
  undefined8 local_18;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_28.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_28.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_18 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_28);
  sVar1 = sysbvm_environment_lookBreakTargetRecursively(context,arguments[1]);
  if (sVar1 == 0) {
    sysbvm_error("No target available for break.");
  }
  if (sVar1 == 0 || (sVar1 & 0xf) != 0) {
    targetRecord = (sysbvm_stackFrameRecord_t *)((long)sVar1 >> 4);
  }
  else {
    targetRecord = *(sysbvm_stackFrameRecord_t **)(sVar1 + 0x10);
  }
  sysbvm_stackFrame_breakInto(targetRecord);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astBreakNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astBreakNode_t **breakNode = (sysbvm_astBreakNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*breakNode)->super.sourcePosition);

    sysbvm_tuple_t breakTarget = sysbvm_environment_lookBreakTargetRecursively(context, *environment);
    if(!breakTarget)
        sysbvm_error("No target available for break.");

    sysbvm_stackFrame_breakInto((sysbvm_stackFrameRecord_t*)sysbvm_tuple_uintptr_decode(breakTarget));
    return SYSBVM_NULL_TUPLE;
}